

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomHeap.h
# Opt level: O2

BVIndex __thiscall
Memory::CustomHeap::Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
GetFreeIndexForPage(Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this,
                   Page *page,size_t bytes)

{
  uint l;
  BVIndex BVar1;
  
  l = 1;
  if (0x80 < bytes) {
    l = (uint)(bytes >> 7) & 0x1ffffff;
  }
  BVar1 = BVUnitT<unsigned_long>::FirstStringOfOnes(&page->freeBitVector,l);
  return BVar1;
}

Assistant:

inline BVIndex GetFreeIndexForPage(Page* page, DECLSPEC_GUARD_OVERFLOW size_t bytes)
    {
        unsigned int length = GetChunkSizeForBytes(bytes);
        BVIndex index = page->freeBitVector.FirstStringOfOnes(length);

        return index;
    }